

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O2

void deqp::gls::ub::anon_unknown_12::copyUniformData
               (UniformLayout *dstLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *dstBlockPointers,UniformLayout *srcLayout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *srcBlockPointers)

{
  DataType DVar1;
  pointer pBVar2;
  pointer pUVar3;
  pointer pUVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  const_iterator cVar10;
  int iVar11;
  int *piVar12;
  int elementNdx;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  void *__dest;
  void *__src;
  int dstBlockNdx;
  int local_98;
  int local_94;
  UniformLayout *local_90;
  UniformLayout *local_88;
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *local_80;
  _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
  *local_78;
  ulong local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  pointer local_58;
  int *local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  local_70 = (ulong)((long)(srcLayout->blocks).
                           super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(srcLayout->blocks).
                          super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 6;
  iVar9 = 0;
  local_90 = dstLayout;
  local_88 = srcLayout;
  local_80 = &dstBlockPointers->_M_t;
  local_78 = &srcBlockPointers->_M_t;
  while (iVar9 < (int)local_70) {
    pBVar2 = (local_88->blocks).
             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_94 = iVar9;
    cVar10 = std::
             _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
             ::find(local_78,&local_94);
    local_60 = cVar10._M_node[1]._M_parent;
    local_98 = UniformLayout::getBlockIndex(local_90,pBVar2[iVar9].name._M_dataplus._M_p);
    if (-1 < local_98) {
      cVar10 = std::
               _Rb_tree<int,_std::pair<const_int,_void_*>,_std::_Select1st<std::pair<const_int,_void_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               ::find(local_80,&local_98);
      if (-1 < local_98) {
        local_58 = pBVar2 + iVar9;
        local_68 = cVar10._M_node[1]._M_parent;
        piVar12 = *(int **)&(local_58->activeUniformIndices).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl;
        while (piVar12 !=
               *(pointer *)
                ((long)&(local_58->activeUniformIndices).
                        super__Vector_base<int,_std::allocator<int>_> + 8)) {
          iVar9 = *piVar12;
          pUVar3 = (local_88->uniforms).
                   super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_50 = piVar12;
          uVar5 = UniformLayout::getUniformIndex(local_90,pUVar3[iVar9].name._M_dataplus._M_p);
          if (-1 < (int)uVar5) {
            pUVar4 = (local_90->uniforms).
                     super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_38 = (long)&local_68->_M_color + (long)pUVar4[uVar5].offset;
            local_40 = (long)&local_60->_M_color + (long)pUVar3[iVar9].offset;
            iVar6 = glu::getDataTypeScalarSize(pUVar4[uVar5].type);
            DVar1 = pUVar4[uVar5].type;
            local_48 = (size_t)(iVar6 << 2);
            for (iVar6 = 0; iVar6 < pUVar4[uVar5].size; iVar6 = iVar6 + 1) {
              __dest = (void *)(pUVar4[uVar5].arrayStride * iVar6 + local_38);
              __src = (void *)(pUVar3[iVar9].arrayStride * iVar6 + local_40);
              if (DVar1 - TYPE_DOUBLE_MAT2 < 9 || DVar1 - TYPE_FLOAT_MAT2 < 9) {
                iVar7 = glu::getDataTypeMatrixNumRows(pUVar4[uVar5].type);
                iVar8 = glu::getDataTypeMatrixNumColumns(pUVar4[uVar5].type);
                iVar11 = 0;
                if (iVar7 < 1) {
                  iVar7 = 0;
                }
                if (iVar8 < 1) {
                  iVar8 = iVar11;
                }
                for (; iVar11 != iVar8; iVar11 = iVar11 + 1) {
                  iVar13 = 0;
                  for (iVar14 = 0; iVar7 != iVar14; iVar14 = iVar14 + 1) {
                    if (pUVar4[uVar5].isRowMajor == true) {
                      iVar15 = pUVar4[uVar5].matrixStride * iVar14 + iVar11 * 4;
                    }
                    else {
                      iVar15 = pUVar4[uVar5].matrixStride * iVar11 + iVar13;
                    }
                    if (pUVar3[iVar9].isRowMajor == true) {
                      iVar16 = pUVar3[iVar9].matrixStride * iVar14 + iVar11 * 4;
                    }
                    else {
                      iVar16 = pUVar3[iVar9].matrixStride * iVar11 + iVar13;
                    }
                    *(undefined4 *)((long)__dest + (long)iVar15) =
                         *(undefined4 *)((long)__src + (long)iVar16);
                    iVar13 = iVar13 + 4;
                  }
                }
              }
              else {
                memcpy(__dest,__src,local_48);
              }
            }
          }
          piVar12 = local_50 + 1;
        }
      }
    }
    iVar9 = local_94 + 1;
  }
  return;
}

Assistant:

void copyUniformData (const UniformLayout& dstLayout, const std::map<int, void*>& dstBlockPointers, const UniformLayout& srcLayout, const std::map<int, void*>& srcBlockPointers)
{
	// \note Src layout is used as reference in case of activeUniforms happens to be incorrect in dstLayout blocks.
	int numBlocks = (int)srcLayout.blocks.size();

	for (int srcBlockNdx = 0; srcBlockNdx < numBlocks; srcBlockNdx++)
	{
		const BlockLayoutEntry&		srcBlock	= srcLayout.blocks[srcBlockNdx];
		const void*					srcBlockPtr	= srcBlockPointers.find(srcBlockNdx)->second;
		int							dstBlockNdx	= dstLayout.getBlockIndex(srcBlock.name.c_str());
		void*						dstBlockPtr	= dstBlockNdx >= 0 ? dstBlockPointers.find(dstBlockNdx)->second : DE_NULL;

		if (dstBlockNdx < 0)
			continue;

		for (vector<int>::const_iterator srcUniformNdxIter = srcBlock.activeUniformIndices.begin(); srcUniformNdxIter != srcBlock.activeUniformIndices.end(); srcUniformNdxIter++)
		{
			const UniformLayoutEntry&	srcEntry		= srcLayout.uniforms[*srcUniformNdxIter];
			int							dstUniformNdx	= dstLayout.getUniformIndex(srcEntry.name.c_str());

			if (dstUniformNdx < 0)
				continue;

			copyUniformData(dstLayout.uniforms[dstUniformNdx], dstBlockPtr, srcEntry, srcBlockPtr);
		}
	}
}